

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<char_const>
          (StrEqualityMatcher<std::__cxx11::string> *this,char *s,MatchResultListener *listener)

{
  byte bVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (s == (char *)0x0) {
    bVar1 = (byte)this[0x20] ^ 1;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen(s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,s,s + sVar2);
    bVar1 = MatchAndExplain<std::__cxx11::string>(this,&local_48,listener);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (bool)bVar1;
}

Assistant:

bool MatchAndExplain(CharType* s, MatchResultListener* listener) const {
    if (s == NULL) {
      return !expect_eq_;
    }
    return MatchAndExplain(StringType(s), listener);
  }